

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O1

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  __pid_t __pid;
  int extraout_EAX;
  ssize_t sVar2;
  uv_loop_t *puVar3;
  __pid_t __fd;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_2;
  char buf;
  int fd [2];
  int status;
  undefined1 local_118 [32];
  uv_pipe_t local_f8;
  
  handle = (uv_handle_t *)local_118;
  iVar1 = pipe((int *)(local_118 + 0x18));
  local_f8.data = (void *)(long)iVar1;
  local_118._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)local_f8.data == (uv__queue *)0x0) {
    __pid = fork();
    close(local_118._28_4_);
    __fd = local_118._24_4_;
    if (__pid != 0) {
      close(local_118._24_4_);
      __fd = __pid;
      waitpid(__pid,(int *)(local_118 + 0x20),0);
      if (((ulong)local_f8.data & 0xff7f) != 0) {
        run_test_pipe_close_stdout_read_stdin_cold_2();
        goto LAB_001ad224;
      }
LAB_001ad32e:
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      local_118._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      local_118._8_8_ = SEXT48(iVar1);
      if (local_118._0_8_ == local_118._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad397;
    }
LAB_001ad224:
    sVar2 = read(__fd,local_118 + 0x17,1);
    if (2 < (int)sVar2 + 1U) goto LAB_001ad3a4;
    close(0);
    iVar1 = dup(local_118._24_4_);
    local_f8.data = (void *)(long)iVar1;
    local_118._0_8_ = (uv_loop_t *)0xffffffffffffffff;
    if ((uv__queue *)local_f8.data == (uv__queue *)0xffffffffffffffff) goto LAB_001ad3a9;
    puVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)(local_118 + 0x20),0);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001ad3b6;
    iVar1 = uv_pipe_open((uv_pipe_t *)(local_118 + 0x20),0);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001ad3c3;
    iVar1 = uv_read_start((uv_stream_t *)(local_118 + 0x20),alloc_buffer,read_stdin);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ == (uv_loop_t *)0x0) {
      puVar3 = uv_default_loop();
      iVar1 = uv_run(puVar3,UV_RUN_NOWAIT);
      local_118._0_8_ = SEXT48(iVar1);
      local_118._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001ad3dd;
      goto LAB_001ad32e;
    }
  }
  else {
    run_test_pipe_close_stdout_read_stdin_cold_1();
LAB_001ad397:
    run_test_pipe_close_stdout_read_stdin_cold_8();
LAB_001ad3a4:
    run_test_pipe_close_stdout_read_stdin_cold_3();
LAB_001ad3a9:
    run_test_pipe_close_stdout_read_stdin_cold_9();
LAB_001ad3b6:
    run_test_pipe_close_stdout_read_stdin_cold_4();
LAB_001ad3c3:
    run_test_pipe_close_stdout_read_stdin_cold_5();
  }
  run_test_pipe_close_stdout_read_stdin_cold_6();
LAB_001ad3dd:
  run_test_pipe_close_stdout_read_stdin_cold_7();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT_OK(r);
    
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  pid = -1;
#else
  pid = fork();
#endif

  if (pid == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT_NE(r, -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT_OK(r);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}